

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall
QWidgetRepaintManager::markDirty<QRect>
          (QWidgetRepaintManager *this,QRect *r,QWidget *widget,UpdateTime updateTime,
          BufferState bufferState)

{
  undefined8 uVar1;
  QWidgetRepaintManager QVar2;
  undefined4 uVar3;
  long lVar4;
  undefined8 uVar5;
  QGraphicsEffect *this_00;
  undefined4 uVar6;
  QWidgetPrivate *this_01;
  QRect QVar7;
  QRect QVar8;
  QRect QVar9;
  QRect QVar10;
  bool bVar11;
  char cVar12;
  byte bVar13;
  QLoggingCategory *pQVar14;
  QPoint QVar15;
  Representation RVar16;
  Representation RVar17;
  long in_FS_OFFSET;
  QRect QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QRect local_c8;
  undefined1 local_b8 [12];
  Representation RStack_ac;
  QRect local_a8;
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  QDebug local_88;
  QDebug local_80;
  QArrayData *local_78;
  QWidgetData *pQStack_70;
  double local_68;
  double local_60;
  QRect local_58;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar14 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar14->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar14->name;
    local_58.x1.m_i = 2;
    local_58.y1.m_i = 0;
    local_58.x2.m_i = 0;
    local_58.y2.m_i = 0;
    uStack_48 = 0;
    local_44 = 0;
    QMessageLogger::info();
    uVar5 = local_c8._0_8_;
    QVar19.m_data = (storage_type *)0x7;
    QVar19.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<((QTextStream *)uVar5,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_c8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8._0_8_,' ');
    }
    local_98._0_4_ = local_c8.x1.m_i;
    local_98._4_4_ = local_c8.y1.m_i;
    *(int *)(local_c8._0_8_ + 0x28) = *(int *)(local_c8._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)local_b8,(QRect *)local_98);
    uVar5 = local_b8._0_8_;
    QVar20.m_data = (storage_type *)0x2;
    QVar20.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar20);
    QTextStream::operator<<((QTextStream *)uVar5,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._0_8_,' ');
    }
    local_90 = (undefined1  [8])local_b8._0_8_;
    *(int *)(local_b8._0_8_ + 0x28) = *(int *)(local_b8._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)&local_a8,(QWidget *)local_90);
    uVar5 = local_a8._0_8_;
    QVar21.m_data = (storage_type *)0x5;
    QVar21.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar21);
    QTextStream::operator<<((QTextStream *)uVar5,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8._0_8_,' ');
    }
    uVar5 = local_a8._0_8_;
    QVar22.m_data = (storage_type *)0x4;
    QVar22.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar22);
    QTextStream::operator<<((QTextStream *)uVar5,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8._0_8_,' ');
    }
    local_88.stream = (Stream *)local_a8._0_8_;
    *(int *)(local_a8._0_8_ + 0x28) = *(int *)(local_a8._0_8_ + 0x28) + 1;
    qt_QMetaEnum_debugOperator
              (&local_80,(longlong)&local_88,(QMetaObject *)(ulong)updateTime,
               (char *)&staticMetaObject);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug((QDebug *)&local_a8);
    QDebug::~QDebug((QDebug *)local_90);
    QDebug::~QDebug((QDebug *)local_b8);
    QDebug::~QDebug((QDebug *)local_98);
    QDebug::~QDebug((QDebug *)&local_c8);
  }
  QWidgetPrivate::invalidateGraphicsEffectsRecursively(*(QWidgetPrivate **)&widget->field_0x8);
  local_a8.x1.m_i = (r->x1).m_i;
  local_a8.y1.m_i = (r->y1).m_i;
  local_a8.x2.m_i = (r->x2).m_i;
  local_a8.y2.m_i = (r->y2).m_i;
  bVar11 = QWidgetPrivate::shouldPaintOnScreen(*(QWidgetPrivate **)&widget->field_0x8);
  QVar18.x2.m_i = local_a8.x2.m_i;
  QVar18.y2.m_i = local_a8.y2.m_i;
  QVar18.x1.m_i = local_a8.x1.m_i;
  QVar18.y1.m_i = local_a8.y1.m_i;
  lVar4 = *(long *)&widget->field_0x8;
  if (bVar11) {
    cVar12 = QRegion::isEmpty();
    if (cVar12 == '\0') {
      cVar12 = qt_region_strictContains((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),&local_a8);
      QVar9.x2.m_i = local_b8._8_4_;
      QVar9.y2.m_i = RStack_ac.m_i;
      QVar9.x1.m_i = local_b8._0_4_;
      QVar9.y1.m_i = local_b8._4_4_;
      QVar7.x2.m_i = local_c8.x2.m_i;
      QVar7.y2.m_i = local_c8.y2.m_i;
      QVar7.x1.m_i = local_c8.x1.m_i;
      QVar7.y1.m_i = local_c8.y1.m_i;
      if (cVar12 == '\0') {
        cVar12 = QRegion::isEmpty();
        QRegion::operator+=((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),r);
        QVar10.x2.m_i = local_b8._8_4_;
        QVar10.y2.m_i = RStack_ac.m_i;
        QVar10.x1.m_i = local_b8._0_4_;
        QVar10.y1.m_i = local_b8._4_4_;
        QVar8.x2.m_i = local_c8.x2.m_i;
        QVar8.y2.m_i = local_c8.y2.m_i;
        QVar8.x1.m_i = local_c8.x1.m_i;
        QVar8.y1.m_i = local_c8.y1.m_i;
        if ((updateTime != UpdateNow) && (local_c8 = QVar8, _local_b8 = QVar10, cVar12 == '\0'))
        goto LAB_0031f5e4;
      }
      else {
        local_c8 = QVar7;
        _local_b8 = QVar9;
        if (updateTime != UpdateNow) goto LAB_0031f5e4;
        updateTime = UpdateNow;
      }
    }
    else {
      QRegion::QRegion((QRegion *)&local_58,r,Rectangle);
      uVar5 = *(undefined8 *)(*(long *)&widget->field_0x8 + 0xe0);
      *(ulong *)(*(long *)&widget->field_0x8 + 0xe0) = CONCAT44(local_58.y1.m_i,local_58.x1.m_i);
      local_58.x1.m_i = (int)uVar5;
      local_58.y1.m_i = (int)((ulong)uVar5 >> 0x20);
      QRegion::~QRegion((QRegion *)&local_58);
    }
  }
  else if ((*(uint *)(lVar4 + 0x250) >> 0x18 & 1) == 0) {
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
    if (*(QGraphicsEffect **)(lVar4 + 200) != (QGraphicsEffect *)0x0) {
      bVar11 = QGraphicsEffect::isEnabled(*(QGraphicsEffect **)(lVar4 + 200));
      QVar18.x2.m_i = local_a8.x2.m_i;
      QVar18.y2.m_i = local_a8.y2.m_i;
      QVar18.x1.m_i = local_a8.x1.m_i;
      QVar18.y1.m_i = local_a8.y1.m_i;
      if (bVar11) {
        local_78 = (QArrayData *)(double)local_a8.x1.m_i;
        pQStack_70 = (QWidgetData *)(double)local_a8.y1.m_i;
        local_68 = (double)(((long)local_a8.x2.m_i - (long)local_a8.x1.m_i) + 1);
        local_60 = (double)(((long)local_a8.y2.m_i - (long)local_a8.y1.m_i) + 1);
        (**(code **)(**(long **)(lVar4 + 200) + 0x60))(&local_58);
        QVar18 = (QRect)QRectF::toAlignedRect();
      }
    }
    local_58.x1.m_i = 0;
    local_58.y1.m_i = 0;
    _local_b8 = QVar18;
    QVar15 = QWidget::mapTo(widget,*(QWidget **)this,(QPoint *)&local_58);
    RVar17 = QVar15.xp.m_i;
    local_c8.x1.m_i = local_b8._0_4_ + RVar17.m_i;
    RVar16 = QVar15.yp.m_i;
    local_c8.x2.m_i = local_b8._8_4_ + RVar17.m_i;
    local_c8.y1.m_i = local_b8._4_4_ + RVar16.m_i;
    local_c8.y2.m_i = RStack_ac.m_i + RVar16.m_i;
    local_58.x1.m_i = 0;
    local_58.y1.m_i = 0;
    uVar5 = *(undefined8 *)(*(long *)(*(long *)this + 0x20) + 0x1c);
    uVar1 = *(undefined8 *)(*(long *)(*(long *)this + 0x20) + 0x14);
    local_58.x2.m_i = (int)uVar5 - (int)uVar1;
    local_58.y2.m_i = (int)((ulong)uVar5 >> 0x20) - (int)((ulong)uVar1 >> 0x20);
    local_c8 = (QRect)QRect::operator&(&local_c8,&local_58);
    cVar12 = qt_region_strictContains((QRegion *)(this + 0x10),&local_c8);
    if (cVar12 == '\0') {
      if (bufferState == BufferInvalid) {
        bVar13 = QRegion::isEmpty();
        QVar2 = this[0x88];
        lVar4 = *(long *)&widget->field_0x8;
        this_00 = *(QGraphicsEffect **)(lVar4 + 200);
        if (this_00 == (QGraphicsEffect *)0x0) {
          local_58.x1.m_i = (r->x1).m_i;
          local_58.y1.m_i = (r->y1).m_i + RVar16.m_i;
          local_58.x2.m_i = (r->x2).m_i;
          local_58.y2.m_i = RVar16.m_i + (r->y2).m_i;
        }
        else {
          bVar11 = QGraphicsEffect::isEnabled(this_00);
          if (bVar11) {
            uVar3 = r->x1;
            uVar6 = r->y1;
            local_78 = (QArrayData *)(double)(int)uVar3;
            pQStack_70 = (QWidgetData *)(double)(int)uVar6;
            local_68 = (double)(((long)(r->x2).m_i - (long)(int)uVar3) + 1);
            local_60 = (double)(((long)(r->y2).m_i - (long)(int)uVar6) + 1);
            (**(code **)(**(long **)(lVar4 + 200) + 0x60))(&local_58);
            QVar18 = (QRect)QRectF::toAlignedRect();
          }
          else {
            QVar18 = *r;
          }
          local_58.x1 = QVar18.x1.m_i;
          local_58.x2 = QVar18.x2.m_i;
          local_58.y1.m_i = (int)(QVar18._0_8_ + ((ulong)QVar15 & 0xffffffff00000000) >> 0x20);
          local_58.y2.m_i = (int)(((ulong)QVar15 & 0xffffffff00000000) + QVar18._8_8_ >> 0x20);
        }
        local_58.x2.m_i = local_58.x2.m_i + RVar17.m_i;
        local_58.x1.m_i = local_58.x1.m_i + RVar17.m_i;
        QRegion::operator+=((QRegion *)(this + 0x10),&local_58);
        if (updateTime != UpdateNow && (((byte)QVar2 ^ 1) & bVar13) == 0) goto LAB_0031f5e4;
      }
      else if (*(long *)(this + 0x28) == 0) {
        QRegion::QRegion((QRegion *)&local_58,r,Rectangle);
        addDirtyWidget(this,widget,(QRegion *)&local_58);
        QRegion::~QRegion((QRegion *)&local_58);
      }
      else {
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x252) & 8) == 0) {
          QRegion::QRegion((QRegion *)&local_58,r,Rectangle);
          addDirtyWidget(this,widget,(QRegion *)&local_58);
          QRegion::~QRegion((QRegion *)&local_58);
        }
        else {
          cVar12 = qt_region_strictContains
                             ((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),(QRect *)local_b8);
          if (cVar12 == '\0') {
            this_01 = *(QWidgetPrivate **)&widget->field_0x8;
            if (this_01->graphicsEffect != (QGraphicsEffect *)0x0) {
              QVar18 = QWidgetPrivate::effectiveRectFor(this_01,r);
              r = &local_58;
              local_58.x1 = QVar18.x1.m_i;
              local_58.y1 = QVar18.y1.m_i;
              local_58.x2 = QVar18.x2.m_i;
              local_58.y2 = QVar18.y2.m_i;
              this_01 = *(QWidgetPrivate **)&widget->field_0x8;
            }
            QRegion::operator+=(&this_01->dirty,r);
          }
        }
        if (updateTime != UpdateNow) goto LAB_0031f5e4;
        updateTime = UpdateNow;
      }
    }
    else {
      bVar11 = updateTime != UpdateNow;
      updateTime = UpdateNow;
      if (bVar11) goto LAB_0031f5e4;
    }
    widget = *(QWidget **)this;
  }
  else {
    if ((*(uint *)(lVar4 + 0x250) >> 0x13 & 1) == 0) {
      addDirtyRenderToTextureWidget(this,widget);
    }
    if ((updateTime != UpdateNow) && (this[0x88] != (QWidgetRepaintManager)0x0)) goto LAB_0031f5e4;
    widget = *(QWidget **)this;
  }
  sendUpdateRequest(this,widget,updateTime);
LAB_0031f5e4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::markDirty(const T &r, QWidget *widget, UpdateTime updateTime, BufferState bufferState)
{
    qCInfo(lcWidgetPainting) << "Marking" << r << "of" << widget << "dirty"
        << "with" << updateTime;

    Q_ASSERT(tlw->d_func()->extra);
    Q_ASSERT(tlw->d_func()->extra->topextra);
    Q_ASSERT(widget->isVisible() && widget->updatesEnabled());
    Q_ASSERT(widget->window() == tlw);
    Q_ASSERT(!r.isEmpty());

#if QT_CONFIG(graphicseffect)
    widget->d_func()->invalidateGraphicsEffectsRecursively();
#endif

    QRect widgetRect = widgetRectFor(widget, r);

    // ---------------------------------------------------------------------------

    if (widget->d_func()->shouldPaintOnScreen()) {
        if (widget->d_func()->dirty.isEmpty()) {
            widget->d_func()->dirty = r;
            sendUpdateRequest(widget, updateTime);
            return;
        } else if (qt_region_strictContains(widget->d_func()->dirty, widgetRect)) {
            if (updateTime == UpdateNow)
                sendUpdateRequest(widget, updateTime);
            return; // Already dirty
        }

        const bool eventAlreadyPosted = !widget->d_func()->dirty.isEmpty();
        widget->d_func()->dirty += r;
        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(widget, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (QWidgetPrivate::get(widget)->renderToTexture) {
        if (!widget->d_func()->inDirtyList)
            addDirtyRenderToTextureWidget(widget);
        if (!updateRequestSent || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    QRect effectiveWidgetRect = widget->d_func()->effectiveRectFor(widgetRect);
    const QPoint offset = widget->mapTo(tlw, QPoint());
    QRect translatedRect = effectiveWidgetRect.translated(offset);
#if QT_CONFIG(graphicseffect)
    // Graphics effects may exceed window size, clamp
    translatedRect = translatedRect.intersected(QRect(QPoint(), tlw->size()));
#endif
    if (qt_region_strictContains(dirty, translatedRect)) {
        if (updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return; // Already dirty
    }

    // ---------------------------------------------------------------------------

    if (bufferState == BufferInvalid) {
        const bool eventAlreadyPosted = !dirty.isEmpty() || updateRequestSent;
#if QT_CONFIG(graphicseffect)
        if (widget->d_func()->graphicsEffect)
            dirty += widget->d_func()->effectiveRectFor(r).translated(offset);
        else
#endif
            dirty += r.translated(offset);

        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (dirtyWidgets.isEmpty()) {
        addDirtyWidget(widget, r);
        sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (widget->d_func()->inDirtyList) {
        if (!qt_region_strictContains(widget->d_func()->dirty, effectiveWidgetRect)) {
#if QT_CONFIG(graphicseffect)
            if (widget->d_func()->graphicsEffect)
                widget->d_func()->dirty += widget->d_func()->effectiveRectFor(r);
            else
#endif
                widget->d_func()->dirty += r;
        }
    } else {
        addDirtyWidget(widget, r);
    }

    // ---------------------------------------------------------------------------

    if (updateTime == UpdateNow)
        sendUpdateRequest(tlw, updateTime);
}